

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O3

TRANSPORT_LL_HANDLE
IoTHubTransportHttp_Create
          (IOTHUBTRANSPORT_CONFIG *config,TRANSPORT_CALLBACKS_INFO *cb_info,void *ctx)

{
  IOTHUB_CLIENT_CONFIG *pIVar1;
  _Bool _Var2;
  int iVar3;
  HTTPAPIEX_RESULT HVar4;
  LOGGER_LOG p_Var5;
  HTTPTRANSPORT_HANDLE_DATA *handleData;
  VECTOR_HANDLE pVVar6;
  long lVar7;
  TRANSPORT_CALLBACKS_INFO *pTVar8;
  char *pcVar9;
  byte bVar10;
  
  bVar10 = 0;
  if (config == (IOTHUBTRANSPORT_CONFIG *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar9 = "invalid arg (configuration is missing)";
      iVar3 = 0x3be;
LAB_00129cbc:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"IoTHubTransportHttp_Create",iVar3,1,pcVar9);
      return (TRANSPORT_LL_HANDLE)0x0;
    }
  }
  else {
    pIVar1 = config->upperConfig;
    if (pIVar1 == (IOTHUB_CLIENT_CONFIG *)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar9 = "invalid arg (upperConfig is NULL)";
        iVar3 = 0x3c3;
        goto LAB_00129cbc;
      }
    }
    else if (pIVar1->protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar9 = "invalid arg (protocol is NULL)";
        iVar3 = 0x3c8;
        goto LAB_00129cbc;
      }
    }
    else if (pIVar1->iotHubName == (char *)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar9 = "invalid arg (iotHubName is NULL)";
        iVar3 = 0x3cd;
        goto LAB_00129cbc;
      }
    }
    else if (pIVar1->iotHubSuffix == (char *)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar9 = "invalid arg (iotHubSuffix is NULL)";
        iVar3 = 0x3d2;
        goto LAB_00129cbc;
      }
    }
    else {
      iVar3 = IoTHub_Transport_ValidateCallbacks(cb_info);
      if (iVar3 == 0) {
        handleData = (HTTPTRANSPORT_HANDLE_DATA *)malloc(0x70);
        if (handleData == (HTTPTRANSPORT_HANDLE_DATA *)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar9 = "unable to malloc";
            iVar3 = 0x3df;
            goto LAB_00129cbc;
          }
        }
        else {
          HVar4 = HTTPAPIEX_Init();
          if (HVar4 == HTTPAPIEX_ERROR) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                        ,"IoTHubTransportHttp_Create",0x3e3,1,"Error initializing HTTP");
            }
          }
          else {
            _Var2 = create_hostName(handleData,config);
            if (_Var2) {
              _Var2 = create_httpApiExHandle(handleData,config);
              if (_Var2) {
                pVVar6 = VECTOR_create(8);
                handleData->perDeviceList = pVVar6;
                if (pVVar6 != (VECTOR_HANDLE)0x0) {
                  handleData->doBatchedTransfers = false;
                  handleData->getMinimumPollingTime = 0x5dc;
                  handleData->transport_ctx = ctx;
                  pTVar8 = &handleData->transport_callbacks;
                  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
                    pTVar8->msg_input_cb = cb_info->msg_input_cb;
                    cb_info = (TRANSPORT_CALLBACKS_INFO *)
                              ((long)cb_info + (ulong)bVar10 * -0x10 + 8);
                    pTVar8 = (TRANSPORT_CALLBACKS_INFO *)((long)pTVar8 + (ulong)bVar10 * -0x10 + 8);
                  }
                  return handleData;
                }
                HTTPAPIEX_Destroy(handleData->httpApiExHandle);
              }
              STRING_delete(handleData->hostName);
            }
            HTTPAPIEX_Deinit();
          }
          free(handleData);
        }
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar9 = "Invalid transport callback information";
          iVar3 = 0x3d7;
          goto LAB_00129cbc;
        }
      }
    }
  }
  return (TRANSPORT_LL_HANDLE)0x0;
}

Assistant:

static TRANSPORT_LL_HANDLE IoTHubTransportHttp_Create(const IOTHUBTRANSPORT_CONFIG* config, TRANSPORT_CALLBACKS_INFO* cb_info, void* ctx)
{
    HTTPTRANSPORT_HANDLE_DATA* result;
    if (config == NULL)
    {
        LogError("invalid arg (configuration is missing)");
        result = NULL;
    }
    else if (config->upperConfig == NULL)
    {
        LogError("invalid arg (upperConfig is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->protocol == NULL)
    {
        LogError("invalid arg (protocol is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->iotHubName == NULL)
    {
        LogError("invalid arg (iotHubName is NULL)");
        result = NULL;
    }
    else if (config->upperConfig->iotHubSuffix == NULL)
    {
        LogError("invalid arg (iotHubSuffix is NULL)");
        result = NULL;
    }
    else if (IoTHub_Transport_ValidateCallbacks(cb_info) != 0)
    {
        LogError("Invalid transport callback information");
        result = NULL;
    }
    else
    {
        result = (HTTPTRANSPORT_HANDLE_DATA*)malloc(sizeof(HTTPTRANSPORT_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("unable to malloc");
        }
        else if (HTTPAPIEX_Init() == HTTPAPIEX_ERROR)
        {
            LogError("Error initializing HTTP");
            free(result);
            result = NULL;
        }
        else
        {
            bool was_hostName_ok = create_hostName(result, config);
            bool was_httpApiExHandle_ok = was_hostName_ok && create_httpApiExHandle(result, config);
            bool was_perDeviceList_ok = was_httpApiExHandle_ok && create_perDeviceList(result);

            if (was_perDeviceList_ok)
            {
                result->doBatchedTransfers = false;
                result->getMinimumPollingTime = DEFAULT_GETMINIMUMPOLLINGTIME;

                result->transport_ctx = ctx;
                memcpy(&result->transport_callbacks, cb_info, sizeof(TRANSPORT_CALLBACKS_INFO));
            }
            else
            {
                if (was_httpApiExHandle_ok) destroy_httpApiExHandle(result);
                if (was_hostName_ok) destroy_hostName(result);
                HTTPAPIEX_Deinit();

                free(result);
                result = NULL;
            }
        }
    }
    return result;
}